

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path-util.cc
# Opt level: O0

bool tinyusdz::pathutil::ValidatePrimPath(Path *path,string *err)

{
  bool bVar1;
  int iVar2;
  string *psVar3;
  size_type sVar4;
  ulong local_68;
  size_t i;
  string local_58;
  undefined1 local_38 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  element_names;
  string *err_local;
  Path *path_local;
  
  element_names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = err;
  bVar1 = Path::is_valid(path);
  if (bVar1) {
    bVar1 = Path::is_prim_path(path);
    if (bVar1) {
      psVar3 = Path::prim_part_abi_cxx11_(path);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_58,"/",(allocator *)((long)&i + 7));
      iVar2 = ::std::numeric_limits<int>::max();
      split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_38,psVar3,&local_58,iVar2 / 100);
      ::std::__cxx11::string::~string((string *)&local_58);
      ::std::allocator<char>::~allocator((allocator<char> *)((long)&i + 7));
      local_68 = 0;
      while( true ) {
        sVar4 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_38);
        if (sVar4 <= local_68) break;
        psVar3 = (string *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_38,local_68);
        bVar1 = ValidatePrimElementName(psVar3);
        if (!bVar1) {
          if (element_names.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
            ::std::__cxx11::string::operator=
                      ((string *)
                       element_names.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
                       "Prim path is not composed of valid identifiers.");
          }
          path_local._7_1_ = false;
          goto LAB_0029cb86;
        }
        local_68 = local_68 + 1;
      }
      path_local._7_1_ = true;
LAB_0029cb86:
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_38);
    }
    else {
      if (element_names.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
        ::std::__cxx11::string::operator=
                  ((string *)
                   element_names.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,"Path is not Prim path.");
      }
      path_local._7_1_ = false;
    }
  }
  else {
    if (element_names.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
      ::std::__cxx11::string::operator=
                ((string *)
                 element_names.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,"Path is invalid.");
    }
    path_local._7_1_ = false;
  }
  return path_local._7_1_;
}

Assistant:

bool ValidatePrimPath(const Path &path, std::string *err) {
  if (!path.is_valid()) {
    if (err) {
      (*err) = "Path is invalid.";
    }
    return false;
  }

  if (!path.is_prim_path()) {
    if (err) {
      (*err) = "Path is not Prim path.";
    }
    return false;
  }

  const std::vector<std::string> element_names = split(path.prim_part(), "/");

  for (size_t i = 0; i < element_names.size(); i++) {
    if (!ValidatePrimElementName(element_names[i])) {
      if (err) {
        (*err) = "Prim path is not composed of valid identifiers.";
      }
      
      return false;
    }
  }

  return true;
}